

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O3

string * __thiscall TextFile::readLine_abi_cxx11_(string *__return_storage_ptr__,TextFile *this)

{
  char cVar1;
  char32_t cVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->fromMemory != false) || (cVar1 = std::__basic_file<char>::is_open(), cVar1 != '\0')) {
    while (((long)this->contentPos < this->size_ && (cVar2 = readCharacter(this), cVar2 != L'\n')))
    {
      cVar1 = (char)__return_storage_ptr__;
      if (0x7f < (uint)cVar2) {
        if ((uint)cVar2 < 0x800) {
          std::__cxx11::string::push_back(cVar1);
        }
        else {
          std::__cxx11::string::push_back(cVar1);
          std::__cxx11::string::push_back(cVar1);
        }
      }
      std::__cxx11::string::push_back(cVar1);
    }
  }
  this->lineCount = this->lineCount + 1;
  return __return_storage_ptr__;
}

Assistant:

std::string TextFile::readLine()
{
	std::string result;
	char32_t value;

	if (isOpen())
	{
		while (tell() < size() && (value = readCharacter()) != L'\n')
		{
			encodeUtf8(result, value);
		}
	}

	lineCount++;
	return result;
}